

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.hpp
# Opt level: O0

ostream * operator<<(ostream *os,flexfloat<(unsigned_char)__x04_,_(unsigned_char)__x05_> *obj)

{
  bool bVar1;
  long *plVar2;
  int_fast16_t exp_00;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  flexfloat_t *in_RSI;
  ostream *in_RDI;
  double dVar5;
  bitset<4UL> *in_stack_00000018;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_00000020;
  uint_t frac;
  int_fast16_t exp;
  flexfloat_t *in_stack_ffffffffffffffb8;
  ios_base *in_stack_ffffffffffffffc0;
  
  get_manipulator_id();
  plVar2 = std::ios_base::iword
                     (in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  if (*plVar2 == 0) {
    poVar3 = in_RDI;
    dVar5 = flexfloat::operator_cast_to_double((flexfloat *)in_RSI);
    std::ostream::operator<<(poVar3,dVar5);
  }
  else {
    exp_00 = flexfloat_exp(in_stack_ffffffffffffffb8);
    if (exp_00 < 1) {
      flexfloat_denorm_frac(in_RSI,exp_00);
    }
    else {
      flexfloat_frac(in_RSI);
    }
    bVar1 = flexfloat_sign(in_RSI);
    poVar3 = (ostream *)std::ostream::operator<<(in_RDI,bVar1);
    std::operator<<(poVar3,"-");
    std::bitset<4UL>::bitset
              ((bitset<4UL> *)in_stack_ffffffffffffffc0,
               (unsigned_long_long)in_stack_ffffffffffffffb8);
    pbVar4 = std::operator<<(in_stack_00000020,in_stack_00000018);
    std::operator<<(pbVar4,"-");
    std::bitset<5UL>::bitset((bitset<5UL> *)in_stack_ffffffffffffffc0,(unsigned_long_long)in_RDI);
    std::operator<<(in_stack_00000020,(bitset<5UL> *)in_stack_00000018);
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const flexfloat& obj)
    {
        if(os.iword(get_manipulator_id()) == 0)
        {
            #ifndef FLEXFLOAT_ON_QUAD
            os << fp_t(obj);
            #endif
        }
        else
        {
            int_fast16_t exp = flexfloat_exp(&(obj.v));
            uint_t frac;
            if (exp <= 0) {
                frac = flexfloat_denorm_frac(&(obj.v), exp);
                exp = 0;
            }
            else
                frac = flexfloat_frac(&(obj.v));

            os << flexfloat_sign(&(obj.v)) << "-";
            os << std::bitset<exp_bits>(exp) << "-";
            os << std::bitset<frac_bits>(frac);
        }
        return os;
    }